

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * zlib_mem_inflate(char *cdata,size_t csize,size_t *size)

{
  int iVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int alloc_inc;
  uchar *data_tmp;
  int err;
  int data_alloc;
  uchar *data;
  z_stream s;
  size_t *size_local;
  size_t csize_local;
  char *cdata_local;
  
  auVar3._8_4_ = (int)(csize >> 0x20);
  auVar3._0_8_ = csize;
  auVar3._12_4_ = 0x45300000;
  data_tmp._4_4_ =
       (int)(((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(uint)csize) - 4503599627370496.0)) * 1.2 + 100.0);
  s.reserved = (uLong)size;
  _err = (char *)malloc((long)data_tmp._4_4_);
  if (_err == (char *)0x0) {
    cdata_local = (char *)0x0;
  }
  else {
    s.state = (internal_state *)0x0;
    s.zalloc = (alloc_func)0x0;
    s.zfree = (free_func)0x0;
    s.avail_in = 0;
    s._12_4_ = 0;
    s.avail_out = 0;
    s._36_4_ = 0;
    data = (uchar *)cdata;
    s.next_in._0_4_ = (uint)csize;
    s.total_in = (uLong)_err;
    s.next_out._0_4_ = data_tmp._4_4_;
    iVar1 = inflateInit2_(&data,0x2f,"1.2.11",0x70);
    if (iVar1 == 0) {
      while ((uint)s.next_in != 0) {
        s.total_in = (uLong)(_err + s._32_8_);
        iVar1 = inflate(&data,0);
        if (iVar1 == 1) break;
        if (iVar1 != 0) {
          fprintf(_stderr,"zlib inflate error: %s\n",s.total_out);
          break;
        }
        auVar4._8_4_ = s._12_4_;
        auVar4._0_8_ = s._8_8_;
        auVar4._12_4_ = 0x45300000;
        auVar5._8_4_ = s._36_4_;
        auVar5._0_8_ = s._32_8_;
        auVar5._12_4_ = 0x45300000;
        iVar1 = (int)(((double)(uint)s.next_in /
                      ((auVar4._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,s.avail_in) - 4503599627370496.0))) *
                      ((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,s.avail_out) - 4503599627370496.0)) + 100.0);
        data_tmp._4_4_ = iVar1 + data_tmp._4_4_;
        pcVar2 = (char *)realloc(_err,(long)data_tmp._4_4_);
        if (pcVar2 == (char *)0x0) {
          free(_err);
          return (char *)0x0;
        }
        s.next_out._0_4_ = iVar1 + (int)s.next_out;
        _err = pcVar2;
      }
      inflateEnd(&data);
      *(undefined8 *)s.reserved = s._32_8_;
      cdata_local = _err;
    }
    else {
      fprintf(_stderr,"zlib inflateInit error: %s\n",s.total_out);
      free(_err);
      cdata_local = (char *)0x0;
    }
  }
  return cdata_local;
}

Assistant:

char *zlib_mem_inflate(char *cdata, size_t csize, size_t *size) {
    z_stream s;
    unsigned char *data = NULL; /* Uncompressed output */
    int data_alloc = 0;
    int err;

    /* Starting point at uncompressed size, and scale after that */
    data = malloc(data_alloc = csize*1.2+100);
    if (!data)
	return NULL;

    /* Initialise zlib stream */
    s.zalloc = Z_NULL; /* use default allocation functions */
    s.zfree  = Z_NULL;
    s.opaque = Z_NULL;
    s.next_in  = (unsigned char *)cdata;
    s.avail_in = csize;
    s.total_in = 0;
    s.next_out  = data;
    s.avail_out = data_alloc;
    s.total_out = 0;

    //err = inflateInit(&s);
    err = inflateInit2(&s, 15 + 32);
    if (err != Z_OK) {
	fprintf(stderr, "zlib inflateInit error: %s\n", s.msg);
	free(data);
	return NULL;
    }

    /* Decode to 'data' array */
    for (;s.avail_in;) {
	unsigned char *data_tmp;
	int alloc_inc;

	s.next_out = &data[s.total_out];
	err = inflate(&s, Z_NO_FLUSH);
	if (err == Z_STREAM_END)
	    break;

	if (err != Z_OK) {
	    fprintf(stderr, "zlib inflate error: %s\n", s.msg);
	    break;
	}

	/* More to come, so realloc based on growth so far */
	alloc_inc = (double)s.avail_in/s.total_in * s.total_out + 100;
	data = realloc((data_tmp = data), data_alloc += alloc_inc);
	if (!data) {
	    free(data_tmp);
	    return NULL;
	}
	s.avail_out += alloc_inc;
    }
    inflateEnd(&s);

    *size = s.total_out;
    return (char *)data;
}